

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O0

REF_STATUS interpolate(REF_MPI ref_mpi,int argc,char **argv)

{
  uint uVar1;
  REF_DBL *extruded_field;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_DBL *extruded_solution;
  REF_GRID_conflict extruded_grid;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  uint local_a0;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT faceid;
  REF_INT pos;
  REF_INTERP ref_interp;
  REF_DBL *receipt_solution;
  REF_DBL *donor_solution;
  REF_INT persist_ldim;
  REF_INT ldim;
  REF_GRID_conflict receipt_grid;
  REF_GRID_conflict donor_grid;
  char *persist_solb;
  char *donor_meshb;
  char *donor_solb;
  char *receipt_meshb;
  char *receipt_solb;
  char **argv_local;
  REF_MPI pRStack_18;
  int argc_local;
  REF_MPI ref_mpi_local;
  
  receipt_grid = (REF_GRID_conflict)0x0;
  _persist_ldim = (REF_GRID)0x0;
  receipt_solb = (char *)argv;
  argv_local._4_4_ = argc;
  pRStack_18 = ref_mpi;
  if (argc < 6) {
    if (ref_mpi->id == 0) {
      interpolate_help(*argv);
    }
    ref_mpi_local._4_4_ = 1;
  }
  else {
    persist_solb = argv[2];
    donor_meshb = argv[3];
    donor_solb = argv[4];
    receipt_meshb = argv[5];
    ref_mpi_stopwatch_start(ref_mpi);
    if (pRStack_18->n < 2) {
      if (pRStack_18->id == 0) {
        printf("import %s\n",persist_solb);
      }
      ref_private_macro_code_rss_3 = ref_import_by_extension(&receipt_grid,pRStack_18,persist_solb);
      if (ref_private_macro_code_rss_3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x8c3,"interpolate",(ulong)(uint)ref_private_macro_code_rss_3,"import");
        return ref_private_macro_code_rss_3;
      }
      ref_mpi_stopwatch_stop(pRStack_18,"donor import");
    }
    else {
      if (pRStack_18->id == 0) {
        printf("part %s\n",persist_solb);
      }
      ref_private_macro_code_rss_2 = ref_part_by_extension(&receipt_grid,pRStack_18,persist_solb);
      if (ref_private_macro_code_rss_2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x8bf,"interpolate",(ulong)(uint)ref_private_macro_code_rss_2,"part");
        return ref_private_macro_code_rss_2;
      }
      ref_mpi_stopwatch_stop(pRStack_18,"donor part");
    }
    if (pRStack_18->id == 0) {
      printf("  read %ld vertices\n",receipt_grid->node->old_n_global);
    }
    if (pRStack_18->id == 0) {
      printf("part solution %s\n",donor_meshb);
    }
    ref_private_macro_code_rss_4 =
         ref_part_scalar(receipt_grid,(REF_INT *)((long)&donor_solution + 4),&receipt_solution,
                         donor_meshb);
    if (ref_private_macro_code_rss_4 == 0) {
      ref_mpi_stopwatch_stop(pRStack_18,"donor part solution");
      if (pRStack_18->n < 2) {
        if (pRStack_18->id == 0) {
          printf("import %s\n",donor_solb);
        }
        ref_private_macro_code_rss_5 =
             ref_import_by_extension((REF_GRID *)&persist_ldim,pRStack_18,donor_solb);
        if (ref_private_macro_code_rss_5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x8d6,"interpolate",(ulong)(uint)ref_private_macro_code_rss_5,"import");
          return ref_private_macro_code_rss_5;
        }
        ref_mpi_stopwatch_stop(pRStack_18,"receptor import");
      }
      else {
        if (pRStack_18->id == 0) {
          printf("part %s\n",donor_solb);
        }
        ref_private_macro_code_rxs =
             ref_part_by_extension((REF_GRID *)&persist_ldim,pRStack_18,donor_solb);
        if (ref_private_macro_code_rxs != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x8d1,"interpolate",(ulong)(uint)ref_private_macro_code_rxs,"part");
          return ref_private_macro_code_rxs;
        }
        ref_mpi_stopwatch_stop(pRStack_18,"receptor part");
      }
      if (pRStack_18->id == 0) {
        printf("  read %ld vertices\n",_persist_ldim->node->old_n_global);
      }
      if (pRStack_18->id == 0) {
        printf("%d leading dim from %ld donor nodes to %ld receptor nodes\n",
               (ulong)donor_solution._4_4_,receipt_grid->node->old_n_global,
               _persist_ldim->node->old_n_global);
      }
      local_a0 = ref_args_find(argv_local._4_4_,(char **)receipt_solb,"--face",
                               &ref_private_macro_code_rss);
      if ((local_a0 == 0) || (local_a0 == 5)) {
        if ((ref_private_macro_code_rss == -1) ||
           (argv_local._4_4_ + -2 <= ref_private_macro_code_rss)) {
          if (pRStack_18->id == 0) {
            printf("locate receptor nodes\n");
          }
          ref_private_macro_code_rss_10 =
               ref_interp_create((REF_INTERP *)&faceid,receipt_grid,_persist_ldim);
          if (ref_private_macro_code_rss_10 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x8fa,"interpolate",(ulong)(uint)ref_private_macro_code_rss_10,"make interp");
            return ref_private_macro_code_rss_10;
          }
          ref_private_macro_code_rxs_1 = ref_interp_locate(_faceid);
          if (ref_private_macro_code_rxs_1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x8fb,"interpolate",(ulong)(uint)ref_private_macro_code_rxs_1,"map");
            return ref_private_macro_code_rxs_1;
          }
          ref_mpi_stopwatch_stop(pRStack_18,"locate");
          if (pRStack_18->id == 0) {
            printf("interpolate receptor nodes\n");
          }
          if ((int)(donor_solution._4_4_ * _persist_ldim->node->max) < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x8ff,"interpolate","malloc receipt_solution of REF_DBL negative");
            return 1;
          }
          ref_interp = (REF_INTERP)
                       malloc((long)(int)(donor_solution._4_4_ * _persist_ldim->node->max) << 3);
          if (ref_interp == (REF_INTERP)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x8ff,"interpolate","malloc receipt_solution of REF_DBL NULL");
            return 2;
          }
          extruded_grid._4_4_ =
               ref_interp_scalar(_faceid,donor_solution._4_4_,receipt_solution,(REF_DBL *)ref_interp
                                );
          if (extruded_grid._4_4_ != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x901,"interpolate",(ulong)extruded_grid._4_4_,"interp scalar");
            return extruded_grid._4_4_;
          }
          ref_mpi_stopwatch_stop(pRStack_18,"interp");
        }
        else {
          ref_private_macro_code_rss_1 =
               atoi(*(char **)(receipt_solb + (long)(ref_private_macro_code_rss + 1) * 8));
          donor_grid = *(REF_GRID_conflict *)
                        (receipt_solb + (long)(ref_private_macro_code_rss + 2) * 8);
          if (pRStack_18->id == 0) {
            printf("part persist solution %s\n",donor_grid);
          }
          ref_private_status_reis_ai._4_4_ =
               ref_part_scalar(_persist_ldim,(REF_INT *)&donor_solution,(REF_DBL **)&ref_interp,
                               (char *)donor_grid);
          if (ref_private_status_reis_ai._4_4_ != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x8ec,"interpolate",(ulong)ref_private_status_reis_ai._4_4_,"part solution");
            return ref_private_status_reis_ai._4_4_;
          }
          ref_mpi_stopwatch_stop(pRStack_18,"persist part solution");
          ref_private_status_reis_bi = (REF_LONG)(int)donor_solution._4_4_;
          _ref_private_macro_code_rss_7 = (long)(int)donor_solution;
          if (ref_private_status_reis_bi != _ref_private_macro_code_rss_7) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x8ee,"interpolate","persist leading dimension different than donor",
                   ref_private_status_reis_bi,_ref_private_macro_code_rss_7);
            return 1;
          }
          if (pRStack_18->id == 0) {
            printf("update solution on faceid %d\n",(ulong)(uint)ref_private_macro_code_rss_1);
          }
          ref_private_macro_code_rss_8 =
               ref_interp_create((REF_INTERP *)&faceid,receipt_grid,_persist_ldim);
          if (ref_private_macro_code_rss_8 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x8f2,"interpolate",(ulong)(uint)ref_private_macro_code_rss_8,"make interp");
            return ref_private_macro_code_rss_8;
          }
          ref_private_macro_code_rss_9 =
               ref_interp_face_only
                         (_faceid,ref_private_macro_code_rss_1,donor_solution._4_4_,receipt_solution
                          ,(REF_DBL *)ref_interp);
          if (ref_private_macro_code_rss_9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x8f5,"interpolate",(ulong)(uint)ref_private_macro_code_rss_9,"map");
            return ref_private_macro_code_rss_9;
          }
          ref_mpi_stopwatch_stop(pRStack_18,"update");
        }
        extruded_grid._0_4_ =
             ref_args_find(argv_local._4_4_,(char **)receipt_solb,"--extrude",
                           &ref_private_macro_code_rss);
        if (((uint)extruded_grid == 0) || ((uint)extruded_grid == 5)) {
          if (ref_private_macro_code_rss == -1) {
            if (pRStack_18->id == 0) {
              printf("writing receptor solution %s\n",receipt_meshb);
            }
            uVar1 = ref_gather_scalar_by_extension
                              (_persist_ldim,donor_solution._4_4_,(REF_DBL *)ref_interp,(char **)0x0
                               ,receipt_meshb);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x91d,"interpolate",(ulong)uVar1,"gather recept");
              return uVar1;
            }
            ref_mpi_stopwatch_stop(pRStack_18,"gather receptor");
          }
          else {
            if (pRStack_18->id == 0) {
              printf("extrude receptor solution\n");
            }
            uVar1 = ref_grid_extrude_twod((REF_GRID *)&extruded_solution,_persist_ldim,2);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x90b,"interpolate",(ulong)uVar1,"extrude");
              return uVar1;
            }
            if ((int)(donor_solution._4_4_ * *(int *)((long)extruded_solution[1] + 4)) < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x90d,"interpolate","malloc extruded_solution of REF_DBL negative");
              return 1;
            }
            extruded_field =
                 (REF_DBL *)
                 malloc((long)(int)(donor_solution._4_4_ * *(int *)((long)extruded_solution[1] + 4))
                        << 3);
            if (extruded_field == (REF_DBL *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x90d,"interpolate","malloc extruded_solution of REF_DBL NULL");
              return 2;
            }
            uVar1 = ref_grid_extrude_field
                              (_persist_ldim,donor_solution._4_4_,(REF_DBL *)ref_interp,
                               (REF_GRID_conflict)extruded_solution,extruded_field);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x910,"interpolate",(ulong)uVar1,"extrude solution");
              return uVar1;
            }
            if (pRStack_18->id == 0) {
              printf("writing interpolated extruded solution %s\n",receipt_meshb);
            }
            uVar1 = ref_gather_scalar_by_extension
                              ((REF_GRID)extruded_solution,donor_solution._4_4_,extruded_field,
                               (char **)0x0,receipt_meshb);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x915,"interpolate",(ulong)uVar1,"gather recept");
              return uVar1;
            }
            if (extruded_field != (REF_DBL *)0x0) {
              free(extruded_field);
            }
            uVar1 = ref_grid_free((REF_GRID)extruded_solution);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x917,"interpolate",(ulong)uVar1,"free");
              return uVar1;
            }
          }
          if (ref_interp != (REF_INTERP)0x0) {
            free(ref_interp);
          }
          ref_interp_free(_faceid);
          uVar1 = ref_grid_free(_persist_ldim);
          if (uVar1 == 0) {
            if (receipt_solution != (REF_DBL *)0x0) {
              free(receipt_solution);
            }
            ref_mpi_local._4_4_ = ref_grid_free(receipt_grid);
            if (ref_mpi_local._4_4_ == 0) {
              ref_mpi_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x925,"interpolate",(ulong)ref_mpi_local._4_4_,"donor");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x923,"interpolate",(ulong)uVar1,"receipt");
            ref_mpi_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x906,"interpolate",(ulong)(uint)extruded_grid,"arg search");
          ref_mpi_local._4_4_ = (uint)extruded_grid;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x8e4,"interpolate",(ulong)local_a0,"arg search");
        ref_mpi_local._4_4_ = local_a0;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x8cc,"interpolate",(ulong)(uint)ref_private_macro_code_rss_4,"part solution");
      ref_mpi_local._4_4_ = ref_private_macro_code_rss_4;
    }
  }
  return ref_mpi_local._4_4_;
}

Assistant:

static REF_STATUS interpolate(REF_MPI ref_mpi, int argc, char *argv[]) {
  char *receipt_solb;
  char *receipt_meshb;
  char *donor_solb;
  char *donor_meshb;
  char *persist_solb;
  REF_GRID donor_grid = NULL;
  REF_GRID receipt_grid = NULL;
  REF_INT ldim, persist_ldim;
  REF_DBL *donor_solution, *receipt_solution;
  REF_INTERP ref_interp;
  REF_INT pos;
  REF_INT faceid;

  if (argc < 6) goto shutdown;
  donor_meshb = argv[2];
  donor_solb = argv[3];
  receipt_meshb = argv[4];
  receipt_solb = argv[5];

  ref_mpi_stopwatch_start(ref_mpi);

  if (ref_mpi_para(ref_mpi)) {
    if (ref_mpi_once(ref_mpi)) printf("part %s\n", donor_meshb);
    RSS(ref_part_by_extension(&donor_grid, ref_mpi, donor_meshb), "part");
    ref_mpi_stopwatch_stop(ref_mpi, "donor part");
  } else {
    if (ref_mpi_once(ref_mpi)) printf("import %s\n", donor_meshb);
    RSS(ref_import_by_extension(&donor_grid, ref_mpi, donor_meshb), "import");
    ref_mpi_stopwatch_stop(ref_mpi, "donor import");
  }
  if (ref_mpi_once(ref_mpi))
    printf("  read " REF_GLOB_FMT " vertices\n",
           ref_node_n_global(ref_grid_node(donor_grid)));

  if (ref_mpi_once(ref_mpi)) printf("part solution %s\n", donor_solb);
  RSS(ref_part_scalar(donor_grid, &ldim, &donor_solution, donor_solb),
      "part solution");
  ref_mpi_stopwatch_stop(ref_mpi, "donor part solution");

  if (ref_mpi_para(ref_mpi)) {
    if (ref_mpi_once(ref_mpi)) printf("part %s\n", receipt_meshb);
    RSS(ref_part_by_extension(&receipt_grid, ref_mpi, receipt_meshb), "part");
    ref_mpi_stopwatch_stop(ref_mpi, "receptor part");
  } else {
    if (ref_mpi_once(ref_mpi)) printf("import %s\n", receipt_meshb);
    RSS(ref_import_by_extension(&receipt_grid, ref_mpi, receipt_meshb),
        "import");
    ref_mpi_stopwatch_stop(ref_mpi, "receptor import");
  }
  if (ref_mpi_once(ref_mpi))
    printf("  read " REF_GLOB_FMT " vertices\n",
           ref_node_n_global(ref_grid_node(receipt_grid)));

  if (ref_mpi_once(ref_mpi)) {
    printf("%d leading dim from " REF_GLOB_FMT " donor nodes to " REF_GLOB_FMT
           " receptor nodes\n",
           ldim, ref_node_n_global(ref_grid_node(donor_grid)),
           ref_node_n_global(ref_grid_node(receipt_grid)));
  }

  RXS(ref_args_find(argc, argv, "--face", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos && pos < argc - 2) {
    faceid = atoi(argv[pos + 1]);
    persist_solb = argv[pos + 2];
    if (ref_mpi_once(ref_mpi))
      printf("part persist solution %s\n", persist_solb);
    RSS(ref_part_scalar(receipt_grid, &persist_ldim, &receipt_solution,
                        persist_solb),
        "part solution");
    ref_mpi_stopwatch_stop(ref_mpi, "persist part solution");
    REIS(ldim, persist_ldim, "persist leading dimension different than donor");

    if (ref_mpi_once(ref_mpi)) printf("update solution on faceid %d\n", faceid);
    RSS(ref_interp_create(&ref_interp, donor_grid, receipt_grid),
        "make interp");
    RSS(ref_interp_face_only(ref_interp, faceid, ldim, donor_solution,
                             receipt_solution),
        "map");
    ref_mpi_stopwatch_stop(ref_mpi, "update");
  } else {
    if (ref_mpi_once(ref_mpi)) printf("locate receptor nodes\n");
    RSS(ref_interp_create(&ref_interp, donor_grid, receipt_grid),
        "make interp");
    RSS(ref_interp_locate(ref_interp), "map");
    ref_mpi_stopwatch_stop(ref_mpi, "locate");
    if (ref_mpi_once(ref_mpi)) printf("interpolate receptor nodes\n");
    ref_malloc(receipt_solution,
               ldim * ref_node_max(ref_grid_node(receipt_grid)), REF_DBL);
    RSS(ref_interp_scalar(ref_interp, ldim, donor_solution, receipt_solution),
        "interp scalar");
    ref_mpi_stopwatch_stop(ref_mpi, "interp");
  }

  RXS(ref_args_find(argc, argv, "--extrude", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    REF_GRID extruded_grid;
    REF_DBL *extruded_solution = NULL;
    if (ref_mpi_once(ref_mpi)) printf("extrude receptor solution\n");
    RSS(ref_grid_extrude_twod(&extruded_grid, receipt_grid, 2), "extrude");
    ref_malloc(extruded_solution,
               ldim * ref_node_max(ref_grid_node(extruded_grid)), REF_DBL);
    RSS(ref_grid_extrude_field(receipt_grid, ldim, receipt_solution,
                               extruded_grid, extruded_solution),
        "extrude solution");
    if (ref_mpi_once(ref_mpi))
      printf("writing interpolated extruded solution %s\n", receipt_solb);
    RSS(ref_gather_scalar_by_extension(extruded_grid, ldim, extruded_solution,
                                       NULL, receipt_solb),
        "gather recept");
    ref_free(extruded_solution);
    RSS(ref_grid_free(extruded_grid), "free");
  } else {
    if (ref_mpi_once(ref_mpi))
      printf("writing receptor solution %s\n", receipt_solb);
    RSS(ref_gather_scalar_by_extension(receipt_grid, ldim, receipt_solution,
                                       NULL, receipt_solb),
        "gather recept");
    ref_mpi_stopwatch_stop(ref_mpi, "gather receptor");
  }

  ref_free(receipt_solution);
  ref_interp_free(ref_interp);
  RSS(ref_grid_free(receipt_grid), "receipt");
  ref_free(donor_solution);
  RSS(ref_grid_free(donor_grid), "donor");

  return REF_SUCCESS;
shutdown:
  if (ref_mpi_once(ref_mpi)) interpolate_help(argv[0]);
  return REF_FAILURE;
}